

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O0

bool __thiscall
Inferences::InductionClauseIterator::notDoneInt
          (InductionClauseIterator *this,InductionContext *context,Literal *bound1,Literal *bound2,
          Entry **e)

{
  TermList arg1;
  TermList arg1_00;
  bool bVar1;
  int iVar2;
  Term *in_RCX;
  Term *in_RDX;
  Entry **in_RSI;
  InductionContext *in_RDI;
  InductionFormulaIndex *unaff_retaddr;
  Literal *b2;
  Literal *b1;
  TermList ph;
  Term *in_stack_ffffffffffffff58;
  TermList *in_stack_ffffffffffffff60;
  TermList *in_stack_ffffffffffffff70;
  TermList in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  TermList local_30 [2];
  
  getPlaceholderForTerm
            ((vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_> *)ph._content,b1._4_4_);
  Kernel::TermList::TermList(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (in_RDX != (Term *)0x0) {
    in_stack_ffffffffffffff80 = Kernel::Term::functor(in_RDX);
    iVar2 = Kernel::Literal::polarity((Literal *)0x7cdc51);
    in_stack_ffffffffffffff84 = CONCAT13(iVar2 != 0,(int3)in_stack_ffffffffffffff84);
    iVar2 = Kernel::Literal::polarity((Literal *)0x7cdc68);
    if (iVar2 == 0) {
      in_stack_ffffffffffffff78._content = (uint64_t)local_30;
    }
    else {
      in_stack_ffffffffffffff78._content = (uint64_t)Kernel::Term::nthArgument(in_RDX,0);
    }
    iVar2 = Kernel::Literal::polarity((Literal *)0x7cdca9);
    if (iVar2 == 0) {
      in_stack_ffffffffffffff70 = Kernel::Term::nthArgument(in_RDX,1);
    }
    else {
      in_stack_ffffffffffffff70 = local_30;
    }
    arg1._content._4_4_ = in_stack_ffffffffffffff84;
    arg1._content._0_4_ = in_stack_ffffffffffffff80;
    Kernel::Literal::create2
              ((uint)((ulong)in_stack_ffffffffffffff70 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff70 >> 0x18,0),arg1,in_stack_ffffffffffffff78);
  }
  if (in_RCX != (Term *)0x0) {
    Kernel::Term::functor(in_RCX);
    Kernel::Literal::polarity((Literal *)0x7cdd2d);
    iVar2 = Kernel::Literal::polarity((Literal *)0x7cdd44);
    if (iVar2 == 0) {
      Kernel::Term::nthArgument(in_RCX,0);
    }
    iVar2 = Kernel::Literal::polarity((Literal *)0x7cdd83);
    if (iVar2 != 0) {
      Kernel::Term::nthArgument(in_RCX,1);
    }
    arg1_00._content._4_4_ = in_stack_ffffffffffffff84;
    arg1_00._content._0_4_ = in_stack_ffffffffffffff80;
    Kernel::Literal::create2
              ((uint)((ulong)in_stack_ffffffffffffff70 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff70 >> 0x18,0),arg1_00,in_stack_ffffffffffffff78);
  }
  bVar1 = Indexing::InductionFormulaIndex::findOrInsert
                    (unaff_retaddr,in_RDI,in_RSI,(Literal *)in_RDX,(Literal *)in_RCX);
  return bVar1;
}

Assistant:

bool InductionClauseIterator::notDoneInt(InductionContext context, Literal* bound1, Literal* bound2, InductionFormulaIndex::Entry*& e)
{
  ASS_EQ(context._indTerms.size(), 1);
  TermList ph(getPlaceholderForTerm(context._indTerms,0));
  Literal* b1 = nullptr;
  Literal* b2 = nullptr;
  if (bound1) {
    b1 = Literal::create2(bound1->functor(), bound1->polarity(),
      bound1->polarity() ? *bound1->nthArgument(0) : ph,
      bound1->polarity() ? ph : *bound1->nthArgument(1));
  }
  if (bound2) {
    b2 = Literal::create2(bound2->functor(), bound2->polarity(),
      bound2->polarity() ? ph : *bound2->nthArgument(0),
      bound2->polarity() ? *bound2->nthArgument(1) : ph);
  }
  return _formulaIndex.findOrInsert(context, e, b1, b2);
}